

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapValues.cpp
# Opt level: O0

void TTD::NSSnapValues::ParseSnapPrimitiveValue
               (SnapPrimitiveValue *snapValue,bool readSeparator,FileReader *reader,
               SlabAllocator *alloc,
               TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapType::SnapType_*> *ptrIdToTypeMap)

{
  uint uVar1;
  int iVar2;
  int32 iVar3;
  TTD_PTR_ID TVar4;
  SnapType **ppSVar5;
  TTD_WELLKNOWN_TOKEN pcVar6;
  int64 iVar7;
  uint64 uVar8;
  TTString *pTVar9;
  double dVar10;
  bool isWellKnown;
  TTD_PTR_ID snapTypeId;
  TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapType::SnapType_*> *ptrIdToTypeMap_local;
  SlabAllocator *alloc_local;
  FileReader *reader_local;
  bool readSeparator_local;
  SnapPrimitiveValue *snapValue_local;
  
  (*reader->_vptr_FileReader[6])
            (reader,(ulong)readSeparator & 1,reader,
             CONCAT71((int7)((ulong)alloc >> 8),readSeparator) & 0xffffffffffffff01);
  TVar4 = FileReader::ReadAddr(reader,primitiveId,false);
  snapValue->PrimitiveValueId = TVar4;
  TVar4 = FileReader::ReadAddr(reader,typeId,true);
  ppSVar5 = TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapType::SnapType_*>::LookupKnownItem
                      (ptrIdToTypeMap,TVar4);
  snapValue->SnapType = *ppSVar5;
  uVar1 = (*reader->_vptr_FileReader[10])(reader,0x19,1);
  if ((uVar1 & 1) == 0) {
    snapValue->OptWellKnownToken = (TTD_WELLKNOWN_TOKEN)0x0;
    switch(snapValue->SnapType->JsTypeId) {
    case TypeIds_Undefined:
    case TypeIds_Null:
      break;
    case TypeIds_Boolean:
      iVar2 = (*reader->_vptr_FileReader[10])(reader,10,1);
      *(uint *)&snapValue->field_3 = (uint)((byte)iVar2 & 1);
      break;
    default:
      TTDAbort_unrecoverable_error
                ("These are supposed to be primitive values e.g., no pointers or properties.");
    case TypeIds_Number:
      dVar10 = FileReader::ReadDouble(reader,doubleVal,true);
      (snapValue->field_3).u_doubleValue = dVar10;
      break;
    case TypeIds_Int64Number:
      iVar7 = FileReader::ReadInt64(reader,i64Val,true);
      (snapValue->field_3).u_int64Value = iVar7;
      break;
    case TypeIds_LastNumberType:
      uVar8 = FileReader::ReadUInt64(reader,u64Val,true);
      (snapValue->field_3).u_uint64Value = uVar8;
      break;
    case TypeIds_String:
      pTVar9 = SlabAllocatorBase<0>::SlabAllocateStruct<TTD::TTString>(alloc);
      (snapValue->field_3).u_stringValue = pTVar9;
      FileReader::ReadString<TTD::SlabAllocatorBase<0>>
                (reader,stringVal,alloc,(snapValue->field_3).u_stringValue,true);
      break;
    case TypeIds_Symbol:
      iVar3 = FileReader::ReadInt32(reader,propertyId,true);
      (snapValue->field_3).u_boolValue = iVar3;
    }
  }
  else {
    pcVar6 = FileReader::ReadWellKnownToken<TTD::SlabAllocatorBase<0>>
                       (reader,wellKnownToken,alloc,true);
    snapValue->OptWellKnownToken = pcVar6;
    (snapValue->field_3).u_int64Value = 0;
  }
  (*reader->_vptr_FileReader[7])();
  return;
}

Assistant:

void ParseSnapPrimitiveValue(SnapPrimitiveValue* snapValue, bool readSeparator, FileReader* reader, SlabAllocator& alloc, const TTDIdentifierDictionary<TTD_PTR_ID, NSSnapType::SnapType*>& ptrIdToTypeMap)
        {
            reader->ReadRecordStart(readSeparator);
            snapValue->PrimitiveValueId = reader->ReadAddr(NSTokens::Key::primitiveId);

            TTD_PTR_ID snapTypeId = reader->ReadAddr(NSTokens::Key::typeId, true);
            snapValue->SnapType = ptrIdToTypeMap.LookupKnownItem(snapTypeId);

            bool isWellKnown = reader->ReadBool(NSTokens::Key::isWellKnownToken, true);
            if(isWellKnown)
            {
                snapValue->OptWellKnownToken = reader->ReadWellKnownToken(NSTokens::Key::wellKnownToken, alloc, true);

                //just clear it to help avoid any confusion later
                snapValue->u_uint64Value = 0;
            }
            else
            {
                snapValue->OptWellKnownToken = nullptr;

                switch(snapValue->SnapType->JsTypeId)
                {
                case Js::TypeIds_Undefined:
                case Js::TypeIds_Null:
                    break;
                case Js::TypeIds_Boolean:
                    snapValue->u_boolValue = reader->ReadBool(NSTokens::Key::boolVal, true);
                    break;
                case Js::TypeIds_Number:
                    snapValue->u_doubleValue = reader->ReadDouble(NSTokens::Key::doubleVal, true);
                    break;
                case Js::TypeIds_Int64Number:
                    snapValue->u_int64Value = reader->ReadInt64(NSTokens::Key::i64Val, true);
                    break;
                case Js::TypeIds_UInt64Number:
                    snapValue->u_uint64Value = reader->ReadUInt64(NSTokens::Key::u64Val, true);
                    break;
                case Js::TypeIds_String:
                    snapValue->u_stringValue = alloc.SlabAllocateStruct<TTString>();
                    reader->ReadString(NSTokens::Key::stringVal, alloc, *(snapValue->u_stringValue), true);
                    break;
                case Js::TypeIds_Symbol:
                    snapValue->u_propertyIdValue = (Js::PropertyId)reader->ReadInt32(NSTokens::Key::propertyId, true);
                    break;
                default:
                    TTDAssert(false, "These are supposed to be primitive values e.g., no pointers or properties.");
                    break;
                }
            }

            reader->ReadRecordEnd();
        }